

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

int cppcms_capi_session_is_set(cppcms_capi_session *session,char *key)

{
  session_interface *this;
  bool bVar1;
  uint uVar2;
  allocator local_41;
  string local_40;
  
  uVar2 = 0xffffffff;
  if (session != (cppcms_capi_session *)0x0) {
    anon_unknown.dwarf_329815::check_str(key);
    cppcms_capi_session::check_loaded(session);
    this = (session->p).ptr_;
    std::__cxx11::string::string((string *)&local_40,key,&local_41);
    bVar1 = cppcms::session_interface::is_set(this,&local_40);
    uVar2 = (uint)bVar1;
    std::__cxx11::string::~string((string *)&local_40);
  }
  return uVar2;
}

Assistant:

int cppcms_capi_session_is_set(cppcms_capi_session *session,char const *key)
{
	TRY {
		if(!session)
			return -1;
		check_str(key);
		session->check_loaded();
		return session->p->is_set(key);
	}